

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::SelectConstant<duckdb::interval_t,duckdb::interval_t,duckdb::Equals>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  int *piVar1;
  unsigned_long *puVar2;
  int *piVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  idx_t iVar6;
  sel_t sVar7;
  long lVar8;
  long lVar9;
  
  piVar1 = (int *)left->data;
  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  piVar3 = (int *)right->data;
  if (((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) &&
     ((puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar2 == (unsigned_long *)0x0 || ((*puVar2 & 1) != 0)))) {
    if (((*piVar1 != *piVar3) || (piVar1[1] != piVar3[1])) ||
       (*(long *)(piVar1 + 2) != *(long *)(piVar3 + 2))) {
      lVar8 = (long)piVar1[1] + *(long *)(piVar1 + 2) / 86400000000;
      lVar9 = (long)piVar3[1] + *(long *)(piVar3 + 2) / 86400000000;
      if ((((long)*piVar1 + lVar8 / 0x1e != (long)*piVar3 + lVar9 / 0x1e) ||
          (lVar8 % 0x1e != lVar9 % 0x1e)) ||
         (*(long *)(piVar1 + 2) % 86400000000 != *(long *)(piVar3 + 2) % 86400000000))
      goto LAB_00ef0129;
    }
    if (count != 0 && true_sel != (SelectionVector *)0x0) {
      psVar4 = sel->sel_vector;
      psVar5 = true_sel->sel_vector;
      iVar6 = 0;
      do {
        sVar7 = (sel_t)iVar6;
        if (psVar4 != (sel_t *)0x0) {
          sVar7 = psVar4[iVar6];
        }
        psVar5[iVar6] = sVar7;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else {
LAB_00ef0129:
    if (count != 0 && false_sel != (SelectionVector *)0x0) {
      psVar4 = sel->sel_vector;
      psVar5 = false_sel->sel_vector;
      iVar6 = 0;
      do {
        sVar7 = (sel_t)iVar6;
        if (psVar4 != (sel_t *)0x0) {
          sVar7 = psVar4[iVar6];
        }
        psVar5[iVar6] = sVar7;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    count = 0;
  }
  return count;
}

Assistant:

static idx_t SelectConstant(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                            SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);

		// both sides are constant, return either 0 or the count
		// in this case we do not fill in the result selection vector at all
		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right) || !OP::Operation(*ldata, *rdata)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		} else {
			if (true_sel) {
				for (idx_t i = 0; i < count; i++) {
					true_sel->set_index(i, sel->get_index(i));
				}
			}
			return count;
		}
	}